

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O1

int comex_rmw(int comex_op,void *ploc,void *prem,int extra,int proc,comex_group_t group)

{
  size_t size_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long *__src;
  undefined8 *__ptr;
  char *message;
  uint uVar5;
  char *pcVar6;
  undefined4 uVar7;
  int size;
  int world_proc;
  int local_44;
  void *local_40;
  int local_34;
  
  iVar4 = comex_group_size(group,&local_44);
  if (iVar4 != 0) {
    pcVar6 = "COMEX_SUCCESS == ierr";
LAB_0010a820:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x69a,"int comex_rmw(int, void *, void *, int, int, comex_group_t)");
  }
  if (proc < 0) {
    pcVar6 = "proc >= 0";
    goto LAB_0010a820;
  }
  if (local_44 <= proc) {
    pcVar6 = "proc < size";
    goto LAB_0010a820;
  }
  local_40 = prem;
  if (group != 0) {
    comex_group_translate_world(group,proc,&local_34);
    proc = local_34;
  }
  switch(comex_op) {
  case 10:
    __src = (long *)_my_malloc(4);
    *(int *)__src = *ploc;
    uVar7 = 0xf;
    break;
  case 0xb:
    __src = (long *)_my_malloc(8);
    *__src = *ploc;
    uVar7 = 0xf;
    goto LAB_0010a74e;
  case 0xc:
    __src = (long *)_my_malloc(4);
    *(int *)__src = extra;
    uVar7 = 0xd;
    break;
  case 0xd:
    __src = (long *)_my_malloc(8);
    *__src = (long)extra;
    uVar7 = 0xd;
LAB_0010a74e:
    uVar5 = 8;
    goto LAB_0010a753;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/comex.c"
                  ,0x6b9,"int comex_rmw(int, void *, void *, int, int, comex_group_t)");
  }
  uVar5 = 4;
LAB_0010a753:
  pcVar6 = (char *)_my_malloc(1);
  __ptr = (undefined8 *)_my_malloc(0x28);
  *(undefined4 *)__ptr = uVar7;
  __ptr[1] = local_40;
  __ptr[2] = ploc;
  *(uint *)(__ptr + 3) = uVar5;
  __ptr[4] = pcVar6;
  *pcVar6 = '\x01';
  size_00 = (ulong)uVar5 + 0x28;
  message = (char *)_my_malloc(size_00);
  uVar1 = __ptr[1];
  uVar2 = __ptr[2];
  uVar3 = __ptr[3];
  *(undefined8 *)message = *__ptr;
  *(undefined8 *)(message + 8) = uVar1;
  *(undefined8 *)(message + 0x10) = uVar2;
  *(undefined8 *)(message + 0x18) = uVar3;
  *(undefined8 *)(message + 0x20) = __ptr[4];
  memcpy(message + 0x28,__src,(ulong)uVar5);
  _mq_push(proc,message,(int)size_00);
  while ('\0' < *pcVar6) {
    comex_make_progress();
  }
  free(pcVar6);
  free(__src);
  free(__ptr);
  return 0;
}

Assistant:

int comex_rmw(
        int comex_op, void *ploc, void *prem, int extra,
        int proc, comex_group_t group)
{
    header_t *header = NULL;
    char *notify = NULL;
    char *payload = NULL;
    char *message = NULL;
    int length = 0;
    op_t op;
    long extra_long = (long)extra;

    CHECK_GROUP(group,proc);
#if DEBUG
    printf("[%d] comex_rmw(%d, %p, %p, %d, %d)\n",
            l_state.rank, comex_op, ploc, prem, extra, proc);
#endif

    switch (comex_op) {
        case COMEX_FETCH_AND_ADD:
            op = OP_FETCH_AND_ADD_REQUEST;
            length = sizeof(int);
            payload = _my_malloc(length);
            _my_memcpy(payload, &extra, length);
            break;
        case COMEX_FETCH_AND_ADD_LONG:
            op = OP_FETCH_AND_ADD_REQUEST;
            length = sizeof(long);
            payload = _my_malloc(length);
            _my_memcpy(payload, &extra_long, length);
            break;
        case COMEX_SWAP:
            op = OP_SWAP_REQUEST;
            length = sizeof(int);
            payload = _my_malloc(length);
            _my_memcpy(payload, ploc, length);
            break;
        case COMEX_SWAP_LONG:
            op = OP_SWAP_REQUEST;
            length = sizeof(long);
            payload = _my_malloc(length);
            _my_memcpy(payload, ploc, length);
            break;
        default: assert(0);
    }

    notify = _my_malloc(sizeof(char));

    /* create and prepare the header */
    header = _my_malloc(sizeof(header_t));
    assert(header);
    header->operation = op;
    header->remote_address = prem;
    header->local_address = ploc;
    header->length = length;
    header->notify_address = notify;

    /* set the value to wait on for a rmw response */
    *notify = 1;

    message = _my_malloc(sizeof(header_t) + length);
    _my_memcpy(message, header, sizeof(header_t));
    _my_memcpy(message+sizeof(header_t), payload, length);

    _mq_push(proc, (char*)message, sizeof(header_t)+length);
    
    while (*notify > 0) {
        comex_make_progress();
#if DEBUG
        printf("[%d] are we stuck? rmw notify=%d\n",
                l_state.rank, (int)*notify);
#endif
    }

    _my_free(notify);
    _my_free(payload);
    _my_free(header);

    return COMEX_SUCCESS;
}